

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O3

bool __thiscall Matrix<Complex>::operator==(Matrix<Complex> *this,Matrix<Complex> *a)

{
  Complex *pCVar1;
  Complex *pCVar2;
  bool bVar3;
  compare_t cVar4;
  ulong uVar5;
  long lVar6;
  
  if (this->M != a->M) {
    return false;
  }
  if (this->N == a->N) {
    bVar3 = true;
    if (this->M * this->N != 0) {
      lVar6 = 0x40;
      uVar5 = 0;
      do {
        pCVar1 = this->arr;
        pCVar2 = a->arr;
        cVar4 = Rational::compare((Rational *)((long)pCVar1 + lVar6 + -0x40),
                                  (Rational *)(lVar6 + -0x40 + (long)pCVar2));
        if (cVar4 != CMP_EQUAL) goto LAB_00136129;
        cVar4 = Rational::compare((Rational *)
                                  ((long)&(pCVar1->_re)._numerator.digits.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start + lVar6),
                                  (Rational *)
                                  ((long)&(pCVar2->_re)._numerator.digits.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start + lVar6));
        if (cVar4 != CMP_EQUAL) goto LAB_00136129;
        uVar5 = uVar5 + 1;
        lVar6 = lVar6 + 0x80;
      } while (uVar5 < this->M * this->N);
      bVar3 = true;
    }
  }
  else {
LAB_00136129:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool Matrix<Field>::operator==(const Matrix &a) const
{
    if(M != a.M || N != a.N)
        return false;
    for(unsigned i = 0; i < N * M; ++i)
    {
        if(arr[i] != a.arr[i])
            return false;
    }
    return true;
}